

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O0

void __thiscall DIS::EntityStatePdu::EntityStatePdu(EntityStatePdu *this)

{
  EntityStatePdu *this_local;
  
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EntityStatePdu_00271d90;
  EntityID::EntityID(&this->_entityID);
  this->_forceId = '\0';
  this->_numberOfArticulationParameters = '\0';
  EntityType::EntityType(&this->_entityType);
  EntityType::EntityType(&this->_alternativeEntityType);
  Vector3Float::Vector3Float(&this->_entityLinearVelocity);
  Vector3Double::Vector3Double(&this->_entityLocation);
  Orientation::Orientation(&this->_entityOrientation);
  this->_entityAppearance = 0;
  DeadReckoningParameter::DeadReckoningParameter(&this->_deadReckoningParameters);
  Marking::Marking(&this->_marking);
  this->_capabilities = 0;
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::vector
            (&this->_articulationParameters);
  Pdu::setPduType((Pdu *)this,'\x01');
  return;
}

Assistant:

EntityStatePdu::EntityStatePdu() : EntityInformationFamilyPdu(),
   _entityID(), 
   _forceId(0), 
   _numberOfArticulationParameters(0), 
   _entityType(), 
   _alternativeEntityType(), 
   _entityLinearVelocity(), 
   _entityLocation(), 
   _entityOrientation(), 
   _entityAppearance(0), 
   _deadReckoningParameters(), 
   _marking(), 
   _capabilities(0)
{
    setPduType( 1 );
}